

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall nite::Texture::Texture(Texture *this,string *path,Color *transparency)

{
  Vec2 local_34 [2];
  Color *local_20;
  Color *transparency_local;
  string *path_local;
  Texture *this_local;
  
  local_20 = transparency;
  transparency_local = (Color *)path;
  path_local = &this->filename;
  std::__cxx11::string::string((string *)this);
  Vec2::Vec2(&this->scale);
  Rect::Rect(&this->region);
  this->objectId = -1;
  this->smooth = false;
  Vec2::Vec2(local_34,1.0,1.0);
  this->scale = local_34[0];
  load(this,(string *)transparency_local,local_20);
  return;
}

Assistant:

nite::Texture::Texture(const String &path, const nite::Color &transparency){
	objectId = -1;
	smooth = false;
	scale = nite::Vec2(1, 1);
	load(path, transparency);
}